

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O3

string * __thiscall Block::CalculateBlockHash_abi_cxx11_(string *__return_storage_ptr__,Block *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1b8;
  stringstream local_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->_bData)._M_dataplus._M_p,(this->_bData)._M_string_length);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->bPrevHash)._M_dataplus._M_p,(this->bPrevHash)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->merkle_root)._M_dataplus._M_p,(this->merkle_root)._M_string_length);
  std::__cxx11::stringbuf::str();
  sha256(__return_storage_ptr__,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

string Block::CalculateBlockHash()
{
	stringstream ss;
	ss<< _bIndex << _cTime << _bData << _bNonce << bPrevHash << merkle_root;
	return sha256(ss.str());

}